

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O0

void test_inst(float id,Am_Object *obj,Am_Object *names,int size)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  ostream *poVar4;
  Am_Object *local_178;
  Am_Object *local_c0;
  bool fail;
  Am_Object local_a8;
  Am_Instance_Iterator local_a0 [8];
  Am_Instance_Iterator iter;
  int local_90;
  int local_8c;
  int j;
  int i;
  int num_results;
  Am_Object local_78;
  Am_Object result_names [10];
  int size_local;
  Am_Object *names_local;
  Am_Object *obj_local;
  float id_local;
  
  local_c0 = &local_78;
  result_names[9].data._4_4_ = size;
  do {
    Am_Object::Am_Object(local_c0);
    local_c0 = local_c0 + 1;
  } while (local_c0 != result_names + 9);
  j = 0;
  Am_Object::Am_Object(&local_a8,(Am_Object *)obj);
  Am_Instance_Iterator::Am_Instance_Iterator(local_a0,(Am_Object *)&local_a8);
  Am_Object::~Am_Object(&local_a8);
  Am_Instance_Iterator::Start();
  while (bVar2 = Am_Instance_Iterator::Last(), ((bVar2 ^ 0xff) & 1) != 0) {
    Am_Instance_Iterator::Get();
    lVar3 = (long)j;
    j = j + 1;
    Am_Object::operator=(result_names + lVar3 + -1,(Am_Object *)&stack0xffffffffffffff50);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff50);
    Am_Instance_Iterator::Next();
  }
  if (j == result_names[9].data._4_4_) {
    bVar1 = false;
    for (local_8c = 0; local_90 = local_8c, local_8c < j + -1; local_8c = local_8c + 1) {
      while (local_90 = local_90 + 1, local_90 < j) {
        bVar2 = Am_Object::operator==
                          (result_names + (long)local_8c + -1,
                           (Am_Object *)(result_names + (long)local_90 + -1));
        if ((bVar2 & 1) != 0) {
          bVar1 = true;
        }
      }
    }
    if (bVar1) {
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,id);
      poVar4 = std::operator<<(poVar4,"       object returned more than once");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      bVar1 = false;
      for (local_8c = 0; local_8c < j; local_8c = local_8c + 1) {
        bVar1 = true;
        for (local_90 = 0; local_90 < result_names[9].data._4_4_; local_90 = local_90 + 1) {
          bVar2 = Am_Object::operator==
                            (names + local_90,(Am_Object *)(result_names + (long)local_8c + -1));
          if ((bVar2 & 1) != 0) {
            bVar1 = false;
            break;
          }
        }
        if (bVar1) break;
      }
      if (!bVar1) {
        if (suppress_successful == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"  result is expected");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        goto LAB_001088db;
      }
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,id);
      poVar4 = std::operator<<(poVar4,"       returned objects do not match expected");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    printf("%f       number of objects do not match\n",(double)id);
  }
  for (local_8c = 0; local_8c < result_names[9].data._4_4_; local_8c = local_8c + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"expected object[");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8c);
    poVar4 = std::operator<<(poVar4,"] = ");
    poVar4 = (ostream *)operator<<(poVar4,(Am_Object *)(names + local_8c));
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  for (local_8c = 0; local_8c < j; local_8c = local_8c + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"result object[");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8c);
    poVar4 = std::operator<<(poVar4,"] = ");
    poVar4 = (ostream *)operator<<(poVar4,(Am_Object *)(result_names + (long)local_8c + -1));
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"*** TEST DID NOT SUCCEED. ***");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  failed_tests = failed_tests + 1;
LAB_001088db:
  Am_Instance_Iterator::~Am_Instance_Iterator(local_a0);
  local_178 = result_names + 9;
  do {
    local_178 = local_178 + -1;
    Am_Object::~Am_Object(local_178);
  } while (local_178 != &local_78);
  return;
}

Assistant:

void
test_inst(float id, Am_Object obj, Am_Object names[], int size)
{
  Am_Object result_names[10];
  int num_results = 0;
  int i, j;

  Am_Instance_Iterator iter = obj;
  iter.Start();
  while (!iter.Last()) {
    result_names[num_results++] = iter.Get();
    iter.Next();
  }
  if (num_results == size) {
    bool fail = false;
    for (i = 0; i < num_results - 1; ++i)
      for (j = i + 1; j < num_results; ++j)
        if (result_names[i] == result_names[j])
          fail = true;
    if (!fail) {
      for (i = 0; i < num_results; ++i) {
        fail = true;
        for (j = 0; j < size; ++j)
          if (names[j] == result_names[i]) {
            fail = false;
            break;
          }
        if (fail)
          break;
      }
      if (!fail) {
        if (!suppress_successful)
          cout << "  result is expected" << endl;
        return;
      } else
        cout << id << "       returned objects do not match expected" << endl;
    } else
      cout << id << "       object returned more than once" << endl;
  } else
    printf("%f       number of objects do not match\n", id);
  for (i = 0; i < size; ++i)
    cout << "expected object[" << i << "] = " << names[i] << " ";
  cout << endl;
  for (i = 0; i < num_results; ++i)
    cout << "result object[" << i << "] = " << result_names[i] << " ";
  cout << endl;
  cout << "*** TEST DID NOT SUCCEED. ***" << endl;
  ++failed_tests;
}